

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpaintengine.cpp
# Opt level: O3

void __thiscall QPaintEngine::drawLines(QPaintEngine *this,QLine *lines,int lineCount)

{
  undefined8 uVar1;
  uint uVar2;
  long lVar3;
  uint uVar4;
  long in_FS_OFFSET;
  double local_2038 [1024];
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  if (lineCount != 0) {
    memset(local_2038,0xff,0x2000);
    do {
      uVar4 = 0;
      if (0 < lineCount) {
        uVar2 = lineCount - 1;
        uVar4 = 0xff;
        if (uVar2 < 0xff) {
          uVar4 = uVar2;
        }
        uVar4 = uVar4 + 1;
        if (0xfe < uVar2) {
          uVar2 = 0xff;
        }
        lVar3 = 0;
        do {
          uVar1 = *(undefined8 *)((long)&(lines->pt1).xp.m_i + lVar3);
          *(double *)((long)local_2038 + lVar3 * 2) = (double)(int)uVar1;
          *(double *)((long)local_2038 + lVar3 * 2 + 8) = (double)(int)((ulong)uVar1 >> 0x20);
          uVar1 = *(undefined8 *)((long)&(lines->pt2).xp.m_i + lVar3);
          *(double *)((long)local_2038 + lVar3 * 2 + 0x10) = (double)(int)uVar1;
          *(double *)((long)local_2038 + lVar3 * 2 + 0x18) = (double)(int)((ulong)uVar1 >> 0x20);
          lVar3 = lVar3 + 0x10;
        } while ((ulong)(uVar2 << 4) + 0x10 != lVar3);
      }
      (*this->_vptr_QPaintEngine[8])(this,local_2038,(ulong)uVar4);
      lines = lines + uVar4;
      lineCount = lineCount - uVar4;
    } while (lineCount != 0);
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

void QPaintEngine::drawLines(const QLine *lines, int lineCount)
{
    struct PointF {
        qreal x;
        qreal y;
    };
    struct LineF {
        PointF p1;
        PointF p2;
    };
    Q_ASSERT(sizeof(PointF) == sizeof(QPointF));
    Q_ASSERT(sizeof(LineF) == sizeof(QLineF));
    LineF fl[256];
    while (lineCount) {
        int i = 0;
        while (i < lineCount && i < 256) {
            fl[i].p1.x = lines[i].x1();
            fl[i].p1.y = lines[i].y1();
            fl[i].p2.x = lines[i].x2();
            fl[i].p2.y = lines[i].y2();
            ++i;
        }
        drawLines((QLineF *)(void *)fl, i);
        lines += i;
        lineCount -= i;
    }
}